

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
          (SharedPtr<vkt::SpirVAssembly::BufferInterface> *this,BufferInterface *ptr)

{
  BufferInterface *pBVar1;
  SharedPtrState<vkt::SpirVAssembly::BufferInterface,_de::DefaultDeleter<vkt::SpirVAssembly::BufferInterface>_>
  *pSVar2;
  DefaultDeleter<vkt::SpirVAssembly::BufferInterface> local_25 [13];
  BufferInterface *local_18;
  BufferInterface *ptr_local;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> *this_local;
  
  this->m_ptr = (BufferInterface *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (BufferInterface *)this;
  pSVar2 = (SharedPtrState<vkt::SpirVAssembly::BufferInterface,_de::DefaultDeleter<vkt::SpirVAssembly::BufferInterface>_>
            *)operator_new(0x20);
  pBVar1 = local_18;
  DefaultDeleter<vkt::SpirVAssembly::BufferInterface>::DefaultDeleter(local_25);
  SharedPtrState<vkt::SpirVAssembly::BufferInterface,_de::DefaultDeleter<vkt::SpirVAssembly::BufferInterface>_>
  ::SharedPtrState(pSVar2,pBVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}